

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void large_batch_write_no_commit_test(void)

{
  void *keylen;
  fdb_doc **doc_00;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  char *key;
  char *bodylen;
  undefined1 local_590 [248];
  char local_498 [88];
  fdb_kvs_config *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  fdb_kvs_handle **in_stack_fffffffffffffbd0;
  fdb_file_handle *in_stack_fffffffffffffbd8;
  fdb_config *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  fdb_file_handle **in_stack_fffffffffffffc48;
  char local_398 [256];
  char local_298 [288];
  undefined1 local_178 [252];
  fdb_status local_7c;
  void *local_78;
  fdb_kvs_handle *local_70;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 500000;
  local_78 = malloc(4000000);
  local_58 = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_178,local_590,0xf8);
  fdb_get_default_kvs_config();
  local_7c = fdb_open(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38)
  ;
  if (local_7c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x304);
    large_batch_write_no_commit_test::__test_pass = 0;
    if (local_7c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x304,"void large_batch_write_no_commit_test()");
    }
  }
  local_7c = fdb_kvs_open(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                          in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  if (local_7c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x306);
    large_batch_write_no_commit_test::__test_pass = 0;
    if (local_7c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x306,"void large_batch_write_no_commit_test()");
    }
  }
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf(local_298,"key%128d",(ulong)local_54);
    sprintf(local_398,"meta%128d",(ulong)local_54);
    sprintf(local_498,"body%128d",(ulong)local_54);
    keylen = (void *)((long)local_78 + (long)(int)local_54 * 8);
    key = local_298;
    doc_00 = (fdb_doc **)strlen(local_298);
    strlen(local_398);
    bodylen = local_498;
    in_stack_fffffffffffffa18 = (fdb_kvs_handle *)strlen(local_498);
    fdb_doc_create(doc_00,key,(size_t)keylen,
                   (void *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                   (size_t)in_stack_fffffffffffffa18,(void *)0x10a24c,(size_t)bodylen);
    fdb_set(local_70,*(fdb_doc **)((long)local_78 + (long)(int)local_54 * 8));
    fdb_doc_free((fdb_doc *)0x10a286);
  }
  local_7c = fdb_kvs_close(in_stack_fffffffffffffa18);
  if (local_7c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x315);
    large_batch_write_no_commit_test::__test_pass = 0;
    if (local_7c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x315,"void large_batch_write_no_commit_test()");
    }
  }
  local_7c = fdb_close((fdb_file_handle *)in_stack_fffffffffffffa18);
  if (local_7c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x317);
    large_batch_write_no_commit_test::__test_pass = 0;
    if (local_7c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x317,"void large_batch_write_no_commit_test()");
    }
  }
  local_7c = fdb_open(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38)
  ;
  if ((local_7c != FDB_RESULT_NO_DB_HEADERS) && (local_7c != FDB_RESULT_SUCCESS)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x31b);
    large_batch_write_no_commit_test::__test_pass = 0;
    if (local_7c != FDB_RESULT_NO_DB_HEADERS && local_7c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_NO_DB_HEADERS || status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x31b,"void large_batch_write_no_commit_test()");
    }
  }
  if ((local_7c == FDB_RESULT_SUCCESS) &&
     (local_7c = fdb_close((fdb_file_handle *)in_stack_fffffffffffffa18),
     local_7c != FDB_RESULT_SUCCESS)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x31e);
    large_batch_write_no_commit_test::__test_pass = 0;
    if (local_7c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x31e,"void large_batch_write_no_commit_test()");
    }
  }
  free(local_78);
  fdb_shutdown();
  memleak_end();
  if (large_batch_write_no_commit_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","large batch write test with no commits");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","large batch write test with no commits");
  }
  return;
}

Assistant:

void large_batch_write_no_commit_test()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 500000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = (fdb_doc **) malloc(sizeof(fdb_doc *) * n);
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], metabuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Write 500K docs to eject and flush some dirty pages into disk.
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%128d", i);
        sprintf(metabuf, "meta%128d", i);
        sprintf(bodybuf, "body%128d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }

    // close without commit
    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_DB_HEADERS ||
             status == FDB_RESULT_SUCCESS); // No dirty pages are flushed into disk.
    if (status == FDB_RESULT_SUCCESS) {
        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    free(doc);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("large batch write test with no commits");
}